

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA4Application.cpp
# Opt level: O1

void PA4Application::usage(string *shortDescription,string *synopsis,string *description)

{
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (shortDescription,0,shortDescription->_M_string_length,
             "Application for programming assignment 4",0x28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (synopsis,0,synopsis->_M_string_length,"pa4",3);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (description,0,description->_M_string_length,
             "  An application for texture mapping.\n  The following key bindings are available to interact with thi application:\n     <up> / <down>    increase / decrease latitude angle of the camera position\n     <left> / <right> increase / decrease longitude angle of the camera position\n     R                reset the view\n"
             ,0x139);
  return;
}

Assistant:

void PA4Application::usage(std::string & shortDescription, std::string & synopsis, std::string & description)
{
  shortDescription = "Application for programming assignment 4";
  synopsis = "pa4";
  description = "  An application for texture mapping.\n"
                "  The following key bindings are available to interact with thi application:\n"
                "     <up> / <down>    increase / decrease latitude angle of the camera position\n"
                "     <left> / <right> increase / decrease longitude angle of the camera position\n"
                "     R                reset the view\n";
}